

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O0

void idx2::Init(decode_data *D,idx2_file *Idx2,allocator *Alloc)

{
  allocator *AllocIn;
  allocator *local_28;
  allocator *Alloc_local;
  idx2_file *Idx2_local;
  decode_data *D_local;
  
  Init(&D->BrickPool,Idx2);
  local_28 = Alloc;
  if (Alloc == (allocator *)0x0) {
    local_28 = (allocator *)BrickAlloc_;
  }
  D->Alloc = local_28;
  AllocIn = &Mallocator()->super_allocator;
  Init<unsigned_long,idx2::file_cache>(&D->FileCacheTable,AllocIn);
  return;
}

Assistant:

void
Init(decode_data* D, const idx2_file* Idx2, allocator* Alloc)
{
  Init(&D->BrickPool, Idx2);
  D->Alloc = Alloc ? Alloc : &BrickAlloc_;
  Init(&D->FileCacheTable);
#if VISUS_IDX2
  Init(&D->FileCache);
#endif
}